

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

bool QObject::disconnect(QObject *sender,char *signal,QObject *receiver,char *method)

{
  QByteArrayView name;
  QByteArrayView name_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  QObject *sender_00;
  size_type sVar6;
  QMetaObject *pQVar7;
  char *in_RCX;
  undefined8 *in_RDX;
  char *in_RSI;
  QVarLengthArray<QArgumentType,_10LL> *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  int method_index;
  QMetaObject *rmeta;
  int signal_index;
  bool res;
  bad_alloc *anon_var_0_1;
  bool method_found;
  int membcode;
  char *method_arg;
  bad_alloc *anon_var_0;
  bool signal_found;
  char *signal_arg;
  QByteArrayView methodName;
  QByteArrayView signalName;
  QMetaObject *smeta;
  QByteArray method_name;
  QByteArray signal_name;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QArgumentTypeArray methodTypes;
  QArgumentTypeArray signalTypes;
  undefined4 in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffabc;
  undefined4 in_stack_fffffffffffffac0;
  int in_stack_fffffffffffffac4;
  undefined7 in_stack_fffffffffffffac8;
  undefined1 in_stack_fffffffffffffacf;
  QVarLengthArray<QArgumentType,_10LL> *in_stack_fffffffffffffad0;
  QObject *in_stack_fffffffffffffad8;
  undefined7 in_stack_fffffffffffffae0;
  undefined1 in_stack_fffffffffffffae7;
  int in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaec;
  undefined7 in_stack_fffffffffffffaf0;
  undefined1 in_stack_fffffffffffffaf7;
  char *in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb04;
  int iVar10;
  char *in_stack_fffffffffffffb10;
  QVarLengthArray<QArgumentType,_10LL> *in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  QArgumentType *in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb3c;
  int in_stack_fffffffffffffb40;
  int in_stack_fffffffffffffb44;
  QVarLengthArray<QArgumentType,_10LL> *in_stack_fffffffffffffb48;
  QArgumentType *in_stack_fffffffffffffb58;
  storage_type *in_stack_fffffffffffffb60;
  qsizetype in_stack_fffffffffffffb68;
  storage_type *in_stack_fffffffffffffb70;
  qsizetype in_stack_fffffffffffffb78;
  uint uVar11;
  byte bVar12;
  char *local_3f0;
  char *local_3e0;
  DisconnectType in_stack_fffffffffffffc30;
  bool local_3c9;
  QMetaMethod local_3c8;
  QByteArrayView local_3b8;
  QByteArrayView local_3a8;
  QByteArrayView local_390;
  QByteArrayView local_380;
  QByteArrayView local_370;
  QByteArrayView local_360;
  QObject *local_350;
  undefined1 *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  undefined1 *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  QMessageLogger local_2e8;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  QVarLengthArray<QArgumentType,_10LL> local_2b8;
  QVarLengthArray<QArgumentType,_10LL> local_160;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI == (QVarLengthArray<QArgumentType,_10LL> *)0x0) ||
     ((in_RDX == (undefined8 *)0x0 && (in_RCX != (char *)0x0)))) {
    local_2c8 = &DAT_aaaaaaaaaaaaaaaa;
    local_2c0 = &DAT_aaaaaaaaaaaaaaaa;
    lcConnect();
    anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
               CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_2c8);
      if (!bVar1) break;
      anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3f3978);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffad0,
                 (char *)CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),
                 in_stack_fffffffffffffac4,
                 (char *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                 (char *)0x3f3991);
      QMessageLogger::warning(&local_2e8,"QObject::disconnect: Unexpected nullptr parameter");
      local_2c0 = (undefined1 *)((ulong)local_2c0 & 0xffffffffffffff00);
    }
    local_3c9 = false;
    goto LAB_003f4501;
  }
  local_300 = &DAT_aaaaaaaaaaaaaaaa;
  local_2f8 = &DAT_aaaaaaaaaaaaaaaa;
  local_2f0 = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x3f3a08);
  bVar1 = false;
  local_3e0 = in_RSI;
  if (in_RSI == (char *)0x0) {
LAB_003f3bcd:
    local_330 = &DAT_aaaaaaaaaaaaaaaa;
    local_328 = &DAT_aaaaaaaaaaaaaaaa;
    local_320 = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)0x3f3c07);
    bVar2 = false;
    local_3f0 = in_RCX;
    if (in_RCX == (char *)0x0) {
LAB_003f3e0e:
      uVar11 = 0;
      sender_00 = (QObject *)
                  (**(code **)(in_RDI->super_QVLABase<QArgumentType>).super_QVLABaseBase.a)();
      local_360.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_360.m_data = &DAT_aaaaaaaaaaaaaaaa;
      local_350 = sender_00;
      QByteArrayView::QByteArrayView(&local_360);
      memset(&local_160,0xaa,0x158);
      QVarLengthArray<QArgumentType,_10LL>::QVarLengthArray(&local_160);
      QVar8.m_data = in_stack_fffffffffffffb70;
      QVar8.m_size = in_stack_fffffffffffffb78;
      if (local_3e0 != (char *)0x0) {
        QVar8 = QMetaObjectPrivate::decodeMethodSignature
                          ((char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                           (QArgumentTypeArray *)
                           CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
        local_370 = QVar8;
        local_360 = QVar8;
      }
      local_380.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_380.m_data = &DAT_aaaaaaaaaaaaaaaa;
      QByteArrayView::QByteArrayView(&local_380);
      memset(&local_2b8,0xaa,0x158);
      QVarLengthArray<QArgumentType,_10LL>::QVarLengthArray(&local_2b8);
      QVar9.m_data = in_stack_fffffffffffffb60;
      QVar9.m_size = in_stack_fffffffffffffb68;
      if (local_3f0 != (char *)0x0) {
        QVar9 = QMetaObjectPrivate::decodeMethodSignature
                          ((char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                           (QArgumentTypeArray *)
                           CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
        local_390 = QVar9;
        local_380 = QVar9;
      }
      do {
        if (local_3e0 != (char *)0x0) {
          in_stack_fffffffffffffb48 = &local_160;
          local_3a8 = local_360;
          QVLABaseBase::size((QVLABaseBase *)in_stack_fffffffffffffb48);
          in_stack_fffffffffffffb58 =
               QVarLengthArray<QArgumentType,_10LL>::constData
                         ((QVarLengthArray<QArgumentType,_10LL> *)0x3f406a);
          name.m_size._7_1_ = in_stack_fffffffffffffae7;
          name.m_size._0_7_ = in_stack_fffffffffffffae0;
          name.m_data._0_4_ = in_stack_fffffffffffffae8;
          name.m_data._4_4_ = in_stack_fffffffffffffaec;
          in_stack_fffffffffffffb44 =
               QMetaObjectPrivate::indexOfSignalRelative
                         ((QMetaObject **)
                          CONCAT17(in_stack_fffffffffffffacf,in_stack_fffffffffffffac8),name,
                          in_stack_fffffffffffffac4,
                          (QArgumentType *)
                          CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
          if (in_stack_fffffffffffffb44 < 0) break;
          in_stack_fffffffffffffb40 =
               QMetaObjectPrivate::originalClone
                         ((QMetaObject *)
                          CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),0);
          in_stack_fffffffffffffb3c =
               QMetaObjectPrivate::signalOffset
                         ((QMetaObject *)
                          CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
          bVar1 = true;
        }
        if (local_3f0 == (char *)0x0) {
          in_stack_fffffffffffffab8 = 0;
          bVar3 = QMetaObjectPrivate::disconnect
                            (sender_00,QVar8.m_size._4_4_,(QMetaObject *)QVar8.m_data,
                             (QObject *)QVar9.m_size,QVar9.m_data._4_4_,
                             (void **)in_stack_fffffffffffffb58,in_stack_fffffffffffffc30);
          in_stack_fffffffffffffb38 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffb38);
          uVar11 = (uint)((uVar11 & 0x1000000) != 0 || bVar3) << 0x18;
        }
        else {
          (**(code **)*in_RDX)();
          do {
            in_stack_fffffffffffffb18 = &local_2b8;
            local_3b8 = local_380;
            sVar6 = QVLABaseBase::size((QVLABaseBase *)in_stack_fffffffffffffb18);
            in_stack_fffffffffffffb24 = (undefined4)sVar6;
            in_stack_fffffffffffffb28 =
                 QVarLengthArray<QArgumentType,_10LL>::constData
                           ((QVarLengthArray<QArgumentType,_10LL> *)0x3f41ff);
            name_00.m_size._7_1_ = in_stack_fffffffffffffae7;
            name_00.m_size._0_7_ = in_stack_fffffffffffffae0;
            name_00.m_data._0_4_ = in_stack_fffffffffffffae8;
            name_00.m_data._4_4_ = in_stack_fffffffffffffaec;
            iVar4 = QMetaObjectPrivate::indexOfMethod
                              ((QMetaObject *)in_stack_fffffffffffffad8,name_00,
                               in_stack_fffffffffffffac4,
                               (QArgumentType *)
                               CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
            if (-1 < iVar4) {
              while( true ) {
                iVar10 = iVar4;
                iVar5 = QMetaObject::methodOffset
                                  ((QMetaObject *)
                                   CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
                if (iVar5 <= iVar10) break;
                QMetaObject::superClass((QMetaObject *)0x3f427d);
              }
            }
            if (iVar4 < 0) break;
            in_stack_fffffffffffffab8 = 0;
            bVar2 = QMetaObjectPrivate::disconnect
                              (sender_00,QVar8.m_size._4_4_,(QMetaObject *)QVar8.m_data,
                               (QObject *)QVar9.m_size,QVar9.m_data._4_4_,
                               (void **)in_stack_fffffffffffffb58,in_stack_fffffffffffffc30);
            uVar11 = (uint)((uVar11 & 0x1000000) != 0 || bVar2) << 0x18;
            bVar2 = true;
            pQVar7 = QMetaObject::superClass((QMetaObject *)0x3f431f);
            in_stack_fffffffffffffae8 = (int)pQVar7;
            in_stack_fffffffffffffaec = (undefined4)((ulong)pQVar7 >> 0x20);
          } while (pQVar7 != (QMetaObject *)0x0);
        }
        in_stack_fffffffffffffae7 = false;
        if (local_3e0 != (char *)0x0) {
          in_stack_fffffffffffffad8 = (QObject *)QMetaObject::superClass((QMetaObject *)0x3f435f);
          in_stack_fffffffffffffae7 = in_stack_fffffffffffffad8 != (QObject *)0x0;
          local_350 = in_stack_fffffffffffffad8;
        }
      } while ((bool)in_stack_fffffffffffffae7 != false);
      if ((local_3e0 == (char *)0x0) || (bVar1)) {
        if ((local_3f0 != (char *)0x0) && (!bVar2)) {
          err_method_notfound((QObject *)in_stack_fffffffffffffb48,
                              (char *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                              (char *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38))
          ;
          err_info_about_objects
                    ((char *)in_stack_fffffffffffffb28,
                     (QObject *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                     (QObject *)in_stack_fffffffffffffb18);
        }
      }
      else {
        err_method_notfound((QObject *)in_stack_fffffffffffffb48,
                            (char *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                            (char *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
        err_info_about_objects
                  ((char *)in_stack_fffffffffffffb28,
                   (QObject *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                   (QObject *)in_stack_fffffffffffffb18);
      }
      bVar12 = (byte)(uVar11 >> 0x18);
      if (((uVar11 & 0x1000000) != 0) && (local_3e0 == (char *)0x0)) {
        QMetaMethod::QMetaMethod(&local_3c8);
        (**(code **)((in_RDI->super_QVLABase<QArgumentType>).super_QVLABaseBase.a + 0x58))
                  (in_RDI,&local_3c8);
        in_stack_fffffffffffffad0 = in_RDI;
      }
      local_3c9 = (bool)(bVar12 & 1);
      QVarLengthArray<QArgumentType,_10LL>::~QVarLengthArray(in_stack_fffffffffffffad0);
      QVarLengthArray<QArgumentType,_10LL>::~QVarLengthArray(in_stack_fffffffffffffad0);
    }
    else {
      QMetaObject::normalizedSignature(in_stack_fffffffffffffb10);
      QByteArray::operator=
                ((QByteArray *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
      QByteArray::~QByteArray((QByteArray *)0x3f3c72);
      local_3f0 = QByteArray::constData((QByteArray *)0x3f3c7f);
      extract_code(local_3f0);
      bVar3 = check_method_code(in_stack_fffffffffffffae8,
                                (QObject *)
                                CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                                (char *)in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0)
      ;
      if (bVar3) {
        local_3f0 = local_3f0 + 1;
        goto LAB_003f3e0e;
      }
      local_3c9 = false;
    }
    QByteArray::~QByteArray((QByteArray *)0x3f44d2);
  }
  else {
    QMetaObject::normalizedSignature(in_stack_fffffffffffffb10);
    QByteArray::operator=
              ((QByteArray *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
               (QByteArray *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
    QByteArray::~QByteArray((QByteArray *)0x3f3a58);
    local_3e0 = QByteArray::constData((QByteArray *)0x3f3a65);
    bVar2 = check_signal_macro((QObject *)
                               CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                               in_stack_fffffffffffffaf8,
                               (char *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0)
                               ,(char *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8
                                                ));
    if (bVar2) {
      local_3e0 = local_3e0 + 1;
      goto LAB_003f3bcd;
    }
    local_3c9 = false;
  }
  QByteArray::~QByteArray((QByteArray *)0x3f44f0);
LAB_003f4501:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_3c9;
}

Assistant:

bool QObject::disconnect(const QObject *sender, const char *signal,
                         const QObject *receiver, const char *method)
{
    if (sender == nullptr || (receiver == nullptr && method != nullptr)) {
        qCWarning(lcConnect, "QObject::disconnect: Unexpected nullptr parameter");
        return false;
    }

    const char *signal_arg = signal;
    QByteArray signal_name;
    bool signal_found = false;
    if (signal) {
        QT_TRY {
            signal_name = QMetaObject::normalizedSignature(signal);
            signal = signal_name.constData();
        } QT_CATCH (const std::bad_alloc &) {
            // if the signal is already normalized, we can continue.
            if (sender->metaObject()->indexOfSignal(signal + 1) == -1)
                QT_RETHROW;
        }

        if (!check_signal_macro(sender, signal, "disconnect", "unbind"))
            return false;
        signal++; // skip code
    }